

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_ftst_m68k(CPUM68KState_conflict *env,FPReg_conflict *val)

{
  int iVar1;
  floatx80 a;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  uint local_1c;
  uint32_t cc;
  FPReg_conflict *val_local;
  CPUM68KState_conflict *env_local;
  
  local_1c = 0;
  a._10_6_ = 0;
  a._0_10_ = *(unkuint10 *)val;
  iVar1 = floatx80_is_neg(a);
  if (iVar1 != 0) {
    local_1c = 0x8000000;
  }
  a_00._10_6_ = 0;
  a_00._0_10_ = *(unkuint10 *)val;
  iVar1 = floatx80_is_any_nan(a_00);
  if (iVar1 == 0) {
    a_01._10_6_ = 0;
    a_01._0_10_ = *(unkuint10 *)val;
    iVar1 = floatx80_is_infinity(a_01);
    if (iVar1 == 0) {
      a_02._10_6_ = 0;
      a_02._0_10_ = *(unkuint10 *)val;
      iVar1 = floatx80_is_zero(a_02);
      if (iVar1 != 0) {
        local_1c = local_1c | 0x4000000;
      }
    }
    else {
      local_1c = local_1c | 0x2000000;
    }
  }
  else {
    local_1c = local_1c | 0x1000000;
  }
  env->fpsr = env->fpsr & 0xf0ffffff | local_1c;
  return;
}

Assistant:

void HELPER(ftst)(CPUM68KState *env, FPReg *val)
{
    uint32_t cc = 0;

    if (floatx80_is_neg(val->d)) {
        cc |= FPSR_CC_N;
    }

    if (floatx80_is_any_nan(val->d)) {
        cc |= FPSR_CC_A;
    } else if (floatx80_is_infinity(val->d)) {
        cc |= FPSR_CC_I;
    } else if (floatx80_is_zero(val->d)) {
        cc |= FPSR_CC_Z;
    }
    env->fpsr = (env->fpsr & ~FPSR_CC_MASK) | cc;
}